

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMove8<(moira::Instr)71,(moira::Mode)3,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  Ea<(moira::Mode)8,_(moira::Size)4> dst;
  Ea<(moira::Mode)8,_(moira::Size)4> local_3c;
  
  local_3c.reg = op >> 9 & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  local_3c.ext1 = (*this->_vptr_Moira[5])();
  local_3c.ext1 = local_3c.ext1 & 0xffff;
  uVar8 = local_3c.ext1 << 0x10;
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = uVar5 & 0xffff | uVar8;
  pcVar6 = "move";
  if (str->upper != false) {
    pcVar6 = "MOVE";
  }
  cVar4 = *pcVar6;
  while (cVar4 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar6;
  }
  if (str->upper == false) {
    cVar4 = '.';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = ".l"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  else {
    cVar4 = '.';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = ".L"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '(';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  cVar4 = ')';
  lVar7 = 0;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar4;
    cVar4 = ")+"[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  cVar4 = ',';
  lVar7 = 0;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar4;
    cVar4 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmMove8(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AL,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}